

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SequenceRepeatLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_sequencerepeat(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x154) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x154;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    SequenceRepeatLayerParams::SequenceRepeatLayerParams(this_00.sequencerepeat_);
    (this->layer_).sequencerepeat_ = (SequenceRepeatLayerParams *)this_00;
  }
  return (SequenceRepeatLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SequenceRepeatLayerParams* NeuralNetworkLayer::mutable_sequencerepeat() {
  if (!has_sequencerepeat()) {
    clear_layer();
    set_has_sequencerepeat();
    layer_.sequencerepeat_ = new ::CoreML::Specification::SequenceRepeatLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sequenceRepeat)
  return layer_.sequencerepeat_;
}